

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/application.cpp:52:28)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_application_cpp:52:28)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  long *in_RSI;
  Ref<embree::ParseStream> *in_stack_ffffffffffffff88;
  anon_class_8_1_8991fb9c_for_f *in_stack_ffffffffffffff90;
  long *local_40 [5];
  long **local_18;
  long **local_10;
  
  local_18 = local_40;
  local_40[0] = (long *)*in_RSI;
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x10))();
  }
  anon_class_8_1_8991fb9c_for_f::operator()
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(FileName *)0x18070d);
  local_10 = local_40;
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x18))();
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }